

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O0

string * __thiscall Pl_Buffer::getString_abi_cxx11_(string *__return_storage_ptr__,Pl_Buffer *this)

{
  pointer pMVar1;
  logic_error *this_00;
  Pl_Buffer *this_local;
  type *s;
  
  pMVar1 = std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
                     (&this->m);
  if ((pMVar1->ready & 1U) != 0) {
    pMVar1 = std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::
             operator->(&this->m);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pMVar1->data);
    std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
              (&this->m);
    std::__cxx11::string::clear();
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Pl_Buffer::getString() called when not ready");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
Pl_Buffer::getString()
{
    if (!m->ready) {
        throw std::logic_error("Pl_Buffer::getString() called when not ready");
    }
    auto s = std::move(m->data);
    m->data.clear();
    return s;
}